

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

msgpack_zone * msgpack_unpacker_release_zone(msgpack_unpacker *mpac)

{
  _Bool _Var1;
  msgpack_zone *pmVar2;
  msgpack_zone *old;
  msgpack_zone *r;
  msgpack_unpacker *mpac_local;
  
  _Var1 = msgpack_unpacker_flush_zone(mpac);
  if (_Var1) {
    pmVar2 = msgpack_zone_new(0x2000);
    if (pmVar2 == (msgpack_zone *)0x0) {
      mpac_local = (msgpack_unpacker *)0x0;
    }
    else {
      mpac_local = (msgpack_unpacker *)mpac->z;
      mpac->z = pmVar2;
      *(msgpack_zone **)mpac->ctx = mpac->z;
    }
  }
  else {
    mpac_local = (msgpack_unpacker *)0x0;
  }
  return (msgpack_zone *)mpac_local;
}

Assistant:

msgpack_zone* msgpack_unpacker_release_zone(msgpack_unpacker* mpac)
{
    msgpack_zone* r;
    msgpack_zone* old;

    if(!msgpack_unpacker_flush_zone(mpac)) {
        return NULL;
    }

    r = msgpack_zone_new(MSGPACK_ZONE_CHUNK_SIZE);
    if(r == NULL) {
        return NULL;
    }

    old = mpac->z;
    mpac->z = r;
    CTX_CAST(mpac->ctx)->user.z = mpac->z;

    return old;
}